

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O0

int64_t cornelich::vanilla_index::count_index_entries(region *region)

{
  int64_t iVar1;
  uint8_t *puVar2;
  long local_20;
  longlong offset;
  int64_t indices;
  region *region_local;
  
  offset = 0;
  for (local_20 = 0;
      (iVar1 = cornelich::region::size(region), local_20 != iVar1 &&
      (puVar2 = cornelich::region::data(region), *(long *)(puVar2 + local_20) != 0));
      local_20 = local_20 + 8) {
    offset = offset + 1;
  }
  return offset;
}

Assistant:

std::int64_t vanilla_index::count_index_entries(const region & region)
{
    std::int64_t indices = 0;
    for(auto offset = 0LL; offset != region.size(); offset += 8)
    {
        if(!*reinterpret_cast<const std::int64_t*>(region.data() + offset))
            break;
        ++indices;
    }
    return indices;
}